

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

void GetCurrentThreadStackLimits(ULONG_PTR *lowLimit,ULONG_PTR *highLimit)

{
  ULONG_PTR UVar1;
  undefined8 uVar2;
  int iVar3;
  long *plVar4;
  ULONG_PTR *pUVar5;
  long lVar6;
  long in_FS_OFFSET;
  void *stackbase;
  void *pvStack_70;
  int status;
  void *stackend;
  size_t stacksize;
  pthread_t currentThreadHandle;
  ULONG_PTR *highLimit_local;
  ULONG_PTR *lowLimit_local;
  pthread_attr_t attr;
  
  attr._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  currentThreadHandle = (pthread_t)highLimit;
  highLimit_local = lowLimit;
  plVar4 = (long *)__tls_get_addr(&PTR_01e57de8);
  if (*plVar4 == 0) {
    stacksize = pthread_self();
    iVar3 = pthread_getattr_np(stacksize,(pthread_attr_t *)&lowLimit_local);
    if (iVar3 != 0) {
      fprintf(_stderr,"] %s %s:%d","GetCurrentThreadStackLimits",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
              ,0x9c9);
      fprintf(_stderr,"Expression: status == 0, Description: pthread_getattr_np call failed");
    }
    iVar3 = pthread_attr_getstack
                      ((pthread_attr_t *)&lowLimit_local,&stack0xffffffffffffff90,
                       (size_t *)&stackend);
    if (iVar3 != 0) {
      fprintf(_stderr,"] %s %s:%d","GetCurrentThreadStackLimits",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
              ,0x9cf);
      fprintf(_stderr,"Expression: status == 0, Description: pthread_attr_getstack call failed");
    }
    lVar6 = (long)pvStack_70 + (long)stackend;
    pthread_attr_destroy((pthread_attr_t *)&lowLimit_local);
    *highLimit_local = (ULONG_PTR)pvStack_70;
    *(long *)currentThreadHandle = lVar6;
    UVar1 = *highLimit_local;
    pUVar5 = (ULONG_PTR *)__tls_get_addr(&PTR_01e57de8);
    *pUVar5 = UVar1;
    uVar2 = *(undefined8 *)currentThreadHandle;
    lVar6 = __tls_get_addr(&PTR_01e57de8);
    *(undefined8 *)(lVar6 + 8) = uVar2;
  }
  else {
    pUVar5 = (ULONG_PTR *)__tls_get_addr(&PTR_01e57de8);
    *highLimit_local = *pUVar5;
    lVar6 = __tls_get_addr(&PTR_01e57de8);
    *(undefined8 *)currentThreadHandle = *(undefined8 *)(lVar6 + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == attr._48_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void GetCurrentThreadStackLimits(ULONG_PTR* lowLimit, ULONG_PTR* highLimit)
{
#ifndef __IOS__
    if (s_cachedLowLimit)
    {
        *lowLimit = s_cachedLowLimit;
        *highLimit = s_cachedHighLimit;
        return;
    }
#endif
    pthread_t currentThreadHandle = pthread_self();

#ifdef __APPLE__
    GetInternalStackLimit(currentThreadHandle, highLimit, lowLimit);
#else
    pthread_attr_t attr;
    size_t stacksize;
    void* stackend;
    int status;

#if HAVE_PTHREAD_ATTR_GET_NP
    status = pthread_attr_get_np(currentThreadHandle, &attr);
    _ASSERT_MSG(status != 0, "pthread_attr_get_np call failed");
#elif HAVE_PTHREAD_GETATTR_NP
    status = pthread_getattr_np(currentThreadHandle, &attr);
    _ASSERT_MSG(status == 0, "pthread_getattr_np call failed");
#else
#   error "Don't know how to get thread attributes on this platform!"
#endif

    status = pthread_attr_getstack(&attr, &stackend, &stacksize);
    _ASSERT_MSG(status == 0, "pthread_attr_getstack call failed");

    void* stackbase = (void*) ((char*) stackend + stacksize);

    pthread_attr_destroy(&attr);

    *lowLimit = (ULONG_PTR) stackend;
    *highLimit = (ULONG_PTR) stackbase;
#endif

#ifndef __IOS__
    s_cachedLowLimit = *lowLimit;
    s_cachedHighLimit = *highLimit;
#endif
}